

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::ContextArrayPack::render
          (ContextArrayPack *this,Primitive primitive,int firstVertex,int vertexCount,bool useVao,
          float coordScale,float colorScale)

{
  Context *pCVar1;
  uint uVar2;
  uint uVar3;
  deUint32 dVar4;
  int iVar5;
  GLenum GVar6;
  size_type sVar7;
  reference ppCVar8;
  ostream *poVar9;
  undefined8 uVar10;
  string local_3a8 [36];
  uint local_384;
  stringstream local_380 [4];
  deUint32 loc_1;
  stringstream attribName_1;
  ostream local_370;
  int local_1f4;
  string local_1f0 [4];
  int arrayNdx_1;
  uint local_1d0;
  deUint32 loc;
  stringstream local_1c0 [8];
  stringstream attribName;
  ostream local_1b0;
  int local_34;
  uint local_30;
  int arrayNdx;
  deUint32 vaoId;
  deUint32 program;
  float colorScale_local;
  float coordScale_local;
  uint uStack_18;
  bool useVao_local;
  int vertexCount_local;
  int firstVertex_local;
  Primitive primitive_local;
  ContextArrayPack *this_local;
  
  arrayNdx = 0;
  local_30 = 0;
  vaoId = (deUint32)colorScale;
  program = (deUint32)coordScale;
  colorScale_local._3_1_ = useVao;
  coordScale_local = (float)vertexCount;
  uStack_18 = firstVertex;
  vertexCount_local = primitive;
  _firstVertex_local = this;
  updateProgram(this);
  pCVar1 = this->m_ctx;
  uVar2 = tcu::Surface::getWidth(&this->m_screen);
  uVar3 = tcu::Surface::getHeight(&this->m_screen);
  (*pCVar1->_vptr_Context[5])(pCVar1,0,0,(ulong)uVar2,(ulong)uVar3);
  (*this->m_ctx->_vptr_Context[0x2a])(0,0,0,0x3f800000);
  (*this->m_ctx->_vptr_Context[0x2d])(this->m_ctx,0x4000);
  arrayNdx = (*this->m_ctx->_vptr_Context[0x75])(this->m_ctx,this->m_program);
  (*this->m_ctx->_vptr_Context[0x76])(this->m_ctx,(ulong)(uint)arrayNdx);
  dVar4 = (*this->m_ctx->_vptr_Context[0x79])();
  glu::checkError(dVar4,"glUseProgram()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                  ,0x48a);
  pCVar1 = this->m_ctx;
  uVar2 = (*this->m_ctx->_vptr_Context[0x66])(this->m_ctx,(ulong)(uint)arrayNdx,"u_coordScale");
  (*pCVar1->_vptr_Context[0x5a])(program,pCVar1,(ulong)uVar2);
  pCVar1 = this->m_ctx;
  uVar2 = (*this->m_ctx->_vptr_Context[0x66])(this->m_ctx,(ulong)(uint)arrayNdx,"u_colorScale");
  (*pCVar1->_vptr_Context[0x5a])(vaoId,pCVar1,(ulong)uVar2);
  if ((colorScale_local._3_1_ & 1) != 0) {
    (*this->m_ctx->_vptr_Context[0x4c])(this->m_ctx,1,&local_30);
    (*this->m_ctx->_vptr_Context[0x4b])(this->m_ctx,(ulong)local_30);
  }
  for (local_34 = 0; iVar5 = local_34,
      sVar7 = std::vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>::
              size(&this->m_arrays), iVar5 < (int)sVar7; local_34 = local_34 + 1) {
    ppCVar8 = std::vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>::
              operator[](&this->m_arrays,(long)local_34);
    uVar2 = (*((*ppCVar8)->super_Array)._vptr_Array[6])();
    if ((uVar2 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_1c0);
      poVar9 = std::operator<<(&local_1b0,"a_");
      ppCVar8 = std::vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>::
                operator[](&this->m_arrays,(long)local_34);
      iVar5 = (*((*ppCVar8)->super_Array)._vptr_Array[0xe])();
      std::ostream::operator<<(poVar9,iVar5);
      iVar5 = arrayNdx;
      pCVar1 = this->m_ctx;
      std::__cxx11::stringstream::str();
      uVar10 = std::__cxx11::string::c_str();
      uVar2 = (*pCVar1->_vptr_Context[0x59])(pCVar1,(ulong)(uint)iVar5,uVar10);
      std::__cxx11::string::~string(local_1f0);
      local_1d0 = uVar2;
      (*this->m_ctx->_vptr_Context[0x50])(this->m_ctx,(ulong)uVar2);
      dVar4 = (*this->m_ctx->_vptr_Context[0x79])();
      glu::checkError(dVar4,"glEnableVertexAttribArray()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                      ,0x49e);
      ppCVar8 = std::vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>::
                operator[](&this->m_arrays,(long)local_34);
      ContextArray::glBind(*ppCVar8,local_1d0);
      std::__cxx11::stringstream::~stringstream(local_1c0);
    }
  }
  pCVar1 = this->m_ctx;
  GVar6 = ContextArray::primitiveToGL(vertexCount_local);
  (*pCVar1->_vptr_Context[0x68])
            (pCVar1,(ulong)GVar6,(ulong)uStack_18,(ulong)((int)coordScale_local - uStack_18));
  dVar4 = (*this->m_ctx->_vptr_Context[0x79])();
  glu::checkError(dVar4,"glDrawArrays()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                  ,0x4a6);
  for (local_1f4 = 0; iVar5 = local_1f4,
      sVar7 = std::vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>::
              size(&this->m_arrays), iVar5 < (int)sVar7; local_1f4 = local_1f4 + 1) {
    ppCVar8 = std::vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>::
              operator[](&this->m_arrays,(long)local_1f4);
    uVar2 = (*((*ppCVar8)->super_Array)._vptr_Array[6])();
    if ((uVar2 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_380);
      poVar9 = std::operator<<(&local_370,"a_");
      ppCVar8 = std::vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>::
                operator[](&this->m_arrays,(long)local_1f4);
      iVar5 = (*((*ppCVar8)->super_Array)._vptr_Array[0xe])();
      std::ostream::operator<<(poVar9,iVar5);
      iVar5 = arrayNdx;
      pCVar1 = this->m_ctx;
      std::__cxx11::stringstream::str();
      uVar10 = std::__cxx11::string::c_str();
      uVar2 = (*pCVar1->_vptr_Context[0x59])(pCVar1,(ulong)(uint)iVar5,uVar10);
      std::__cxx11::string::~string(local_3a8);
      local_384 = uVar2;
      (*this->m_ctx->_vptr_Context[0x51])(this->m_ctx,(ulong)uVar2);
      dVar4 = (*this->m_ctx->_vptr_Context[0x79])();
      glu::checkError(dVar4,"glDisableVertexAttribArray()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                      ,0x4b2);
      std::__cxx11::stringstream::~stringstream(local_380);
    }
  }
  if ((colorScale_local._3_1_ & 1) != 0) {
    (*this->m_ctx->_vptr_Context[0x4d])(this->m_ctx,1,&local_30);
  }
  (*this->m_ctx->_vptr_Context[0x77])(this->m_ctx,(ulong)(uint)arrayNdx);
  (*this->m_ctx->_vptr_Context[0x76])(this->m_ctx,0);
  pCVar1 = this->m_ctx;
  uVar2 = tcu::Surface::getWidth(&this->m_screen);
  uVar3 = tcu::Surface::getHeight(&this->m_screen);
  (*pCVar1->_vptr_Context[0x80])(pCVar1,&this->m_screen,0,0,(ulong)uVar2,(ulong)uVar3);
  return;
}

Assistant:

void ContextArrayPack::render (Array::Primitive primitive, int firstVertex, int vertexCount, bool useVao, float coordScale, float colorScale)
{
	deUint32 program = 0;
	deUint32 vaoId = 0;

	updateProgram();

	m_ctx.viewport(0, 0, m_screen.getWidth(), m_screen.getHeight());
	m_ctx.clearColor(0.0, 0.0, 0.0, 1.0);
	m_ctx.clear(GL_COLOR_BUFFER_BIT);

	program = m_ctx.createProgram(m_program);

	m_ctx.useProgram(program);
	GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glUseProgram()");

	m_ctx.uniform1f(m_ctx.getUniformLocation(program, "u_coordScale"), coordScale);
	m_ctx.uniform1f(m_ctx.getUniformLocation(program, "u_colorScale"), colorScale);

	if (useVao)
	{
		m_ctx.genVertexArrays(1, &vaoId);
		m_ctx.bindVertexArray(vaoId);
	}

	for (int arrayNdx = 0; arrayNdx < (int)m_arrays.size(); arrayNdx++)
	{
		if (m_arrays[arrayNdx]->isBound())
		{
			std::stringstream attribName;
			attribName << "a_" << m_arrays[arrayNdx]->getAttribNdx();

			deUint32 loc = m_ctx.getAttribLocation(program, attribName.str().c_str());
			m_ctx.enableVertexAttribArray(loc);
			GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glEnableVertexAttribArray()");

			m_arrays[arrayNdx]->glBind(loc);
		}
	}

	DE_ASSERT((firstVertex % 6) == 0);
	m_ctx.drawArrays(ContextArray::primitiveToGL(primitive), firstVertex, vertexCount - firstVertex);
	GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawArrays()");

	for (int arrayNdx = 0; arrayNdx < (int)m_arrays.size(); arrayNdx++)
	{
		if (m_arrays[arrayNdx]->isBound())
		{
			std::stringstream attribName;
			attribName << "a_" << m_arrays[arrayNdx]->getAttribNdx();

			deUint32 loc = m_ctx.getAttribLocation(program, attribName.str().c_str());

			m_ctx.disableVertexAttribArray(loc);
			GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDisableVertexAttribArray()");
		}
	}

	if (useVao)
		m_ctx.deleteVertexArrays(1, &vaoId);

	m_ctx.deleteProgram(program);
	m_ctx.useProgram(0);
	m_ctx.readPixels(m_screen, 0, 0, m_screen.getWidth(), m_screen.getHeight());
}